

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.h
# Opt level: O3

string * __thiscall JFSON::Json::dump_abi_cxx11_(string *__return_storage_ptr__,Json *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  dump(this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string dump() const {
        std::string out;
        dump(out);
        return out;
    }